

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O3

void __thiscall cmCTestScriptHandler::cmCTestScriptHandler(cmCTestScriptHandler *this)

{
  cmCTestGenericHandler::cmCTestGenericHandler(&this->super_cmCTestGenericHandler);
  (this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler =
       (_func_int **)&PTR_PopulateCustomVectors_0070d080;
  (this->ScriptProcessScope).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->ScriptProcessScope).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->ScriptProcessScope).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->ConfigurationScripts).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ConfigurationScripts).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ConfigurationScripts).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ScriptProcessScope).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->ScriptProcessScope).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->SourceDir)._M_dataplus._M_p = (pointer)&(this->SourceDir).field_2;
  (this->SourceDir)._M_string_length = 0;
  (this->SourceDir).field_2._M_local_buf[0] = '\0';
  (this->BinaryDir)._M_dataplus._M_p = (pointer)&(this->BinaryDir).field_2;
  (this->BinaryDir)._M_string_length = 0;
  (this->BinaryDir).field_2._M_local_buf[0] = '\0';
  (this->BackupSourceDir)._M_dataplus._M_p = (pointer)&(this->BackupSourceDir).field_2;
  (this->BackupSourceDir)._M_string_length = 0;
  (this->BackupSourceDir).field_2._M_local_buf[0] = '\0';
  (this->BackupBinaryDir)._M_dataplus._M_p = (pointer)&(this->BackupBinaryDir).field_2;
  (this->BackupBinaryDir)._M_string_length = 0;
  (this->BackupBinaryDir).field_2._M_local_buf[0] = '\0';
  (this->CTestRoot)._M_dataplus._M_p = (pointer)&(this->CTestRoot).field_2;
  (this->CTestRoot)._M_string_length = 0;
  (this->CTestRoot).field_2._M_local_buf[0] = '\0';
  (this->CVSCheckOut)._M_dataplus._M_p = (pointer)&(this->CVSCheckOut).field_2;
  (this->CVSCheckOut)._M_string_length = 0;
  (this->CVSCheckOut).field_2._M_local_buf[0] = '\0';
  (this->CTestCmd)._M_dataplus._M_p = (pointer)&(this->CTestCmd).field_2;
  (this->CTestCmd)._M_string_length = 0;
  (this->CTestCmd).field_2._M_local_buf[0] = '\0';
  (this->UpdateCmd)._M_dataplus._M_p = (pointer)&(this->UpdateCmd).field_2;
  (this->UpdateCmd)._M_string_length = 0;
  (this->UpdateCmd).field_2._M_local_buf[0] = '\0';
  (this->CTestEnv)._M_dataplus._M_p = (pointer)&(this->CTestEnv).field_2;
  (this->CTestEnv)._M_string_length = 0;
  (this->CTestEnv).field_2._M_local_buf[0] = '\0';
  (this->InitialCache)._M_dataplus._M_p = (pointer)&(this->InitialCache).field_2;
  (this->InitialCache)._M_string_length = 0;
  (this->InitialCache).field_2._M_local_buf[0] = '\0';
  (this->CMakeCmd)._M_dataplus._M_p = (pointer)&(this->CMakeCmd).field_2;
  (this->CMakeCmd)._M_string_length = 0;
  (this->CMakeCmd).field_2._M_local_buf[0] = '\0';
  (this->CMOutFile)._M_dataplus._M_p = (pointer)&(this->CMOutFile).field_2;
  (this->CMOutFile)._M_string_length = 0;
  (this->CMOutFile).field_2._M_local_buf[0] = '\0';
  (this->ExtraUpdates).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ExtraUpdates).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExtraUpdates).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->Backup = false;
  this->EmptyBinDir = false;
  this->EmptyBinDirOnce = false;
  this->CMake = (cmake *)0x0;
  this->ParentMakefile = (cmMakefile *)0x0;
  this->GlobalGenerator = (cmGlobalGenerator *)0x0;
  (this->ScriptStartTime).__d.__r = 0;
  this->Makefile = (cmMakefile *)0x0;
  this->MinimumInterval = 1800.0;
  this->ContinuousDuration = -1.0;
  return;
}

Assistant:

cmCTestScriptHandler::cmCTestScriptHandler()
{
  this->Backup = false;
  this->EmptyBinDir = false;
  this->EmptyBinDirOnce = false;
  this->Makefile = nullptr;
  this->ParentMakefile = nullptr;
  this->CMake = nullptr;
  this->GlobalGenerator = nullptr;

  this->ScriptStartTime = std::chrono::steady_clock::time_point();

  // the *60 is because the settings are in minutes but GetTime is seconds
  this->MinimumInterval = 30 * 60;
  this->ContinuousDuration = -1;
}